

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psubsb_mips64el(uint64_t fs,uint64_t ft)

{
  char cVar1;
  char cVar2;
  long lVar3;
  uint8_t uVar4;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar3 = 0;
  do {
    cVar1 = vs.sb[lVar3];
    cVar2 = vt.sb[lVar3];
    uVar4 = cVar1 - cVar2;
    if (SBORROW1(cVar1,cVar2)) {
      uVar4 = (-1 < (char)(cVar1 - cVar2)) + '\x7f';
    }
    vs.ub[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return vs.d;
}

Assistant:

uint64_t helper_psubsb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.sb[i] - vt.sb[i];
        vs.sb[i] = SATSB(r);
    }
    return vs.d;
}